

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86::forward_inplace(HardSwish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar5 [16];
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _ans;
  __m128 _p;
  int i;
  __m128 _one;
  __m128 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  Mat local_280;
  float *local_238;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  int local_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  Mat local_1c0;
  float *local_178;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c4;
  float *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_15c = *(int *)(in_RSI + 0x2c);
  local_160 = *(int *)(in_RSI + 0x30);
  local_164 = *(int *)(in_RSI + 0x38);
  local_168 = local_15c * local_160;
  local_16c = *(int *)(in_RSI + 0x18);
  if (local_16c == 4) {
    local_16c = 4;
    for (local_170 = 0; local_170 < local_164; local_170 = local_170 + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_1c0);
      ncnn::Mat::~Mat((Mat *)0x8e45e6);
      local_c4 = 0;
      local_d8 = 0;
      uStack_d4 = 0;
      uStack_d0 = 0;
      uStack_cc = 0;
      local_1e8 = 0;
      uStack_1e0 = 0;
      local_e8 = 0x3f800000;
      local_f8 = 0x3f800000;
      uStack_f4 = 0x3f800000;
      uStack_f0 = 0x3f800000;
      uStack_ec = 0x3f800000;
      local_1f8 = 0x3f8000003f800000;
      uStack_1f0 = 0x3f8000003f800000;
      local_178 = pfVar4;
      for (local_1fc = 0; local_1fc < local_168; local_1fc = local_1fc + 1) {
        local_c0 = local_178;
        local_218 = *(undefined8 *)local_178;
        uStack_210 = *(undefined8 *)(local_178 + 2);
        local_118 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_b8 = CONCAT44(local_118,local_118);
        uStack_b0 = CONCAT44(local_118,local_118);
        local_138 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_78 = CONCAT44(local_138,local_138);
        uStack_70 = CONCAT44(local_138,local_138);
        local_68._0_4_ = (float)local_218;
        local_68._4_4_ = (float)((ulong)local_218 >> 0x20);
        uStack_60._0_4_ = (float)uStack_210;
        uStack_60._4_4_ = (float)((ulong)uStack_210 >> 0x20);
        local_a8 = (float)local_68 * local_138;
        fStack_a4 = local_68._4_4_ * local_138;
        fStack_a0 = (float)uStack_60 * local_138;
        fStack_9c = uStack_60._4_4_ * local_138;
        local_228 = CONCAT44(fStack_a4 + local_118,local_a8 + local_118);
        uStack_220._0_4_ = fStack_a0 + local_118;
        uStack_220._4_4_ = fStack_9c + local_118;
        local_48 = local_228;
        uStack_40 = uStack_220;
        auVar5._8_8_ = uStack_220;
        auVar5._0_8_ = local_228;
        auVar5 = maxps(auVar5,ZEXT816(0));
        local_228 = auVar5._0_8_;
        local_28 = local_228;
        uStack_220 = auVar5._8_8_;
        uStack_20 = uStack_220;
        auVar3._8_8_ = 0x3f8000003f800000;
        auVar3._0_8_ = 0x3f8000003f800000;
        auVar5 = minps(auVar5,auVar3);
        local_228 = auVar5._0_8_;
        uVar1 = local_228;
        uStack_220 = auVar5._8_8_;
        uVar2 = uStack_220;
        local_88._0_4_ = auVar5._0_4_;
        local_88._4_4_ = auVar5._4_4_;
        uStack_80._0_4_ = auVar5._8_4_;
        uStack_80._4_4_ = auVar5._12_4_;
        local_228 = CONCAT44(local_88._4_4_ * local_68._4_4_,(float)local_88 * (float)local_68);
        uStack_220._0_4_ = (float)uStack_80 * (float)uStack_60;
        uStack_220._4_4_ = uStack_80._4_4_ * uStack_60._4_4_;
        local_8 = local_178;
        local_18 = local_228;
        uStack_10 = uStack_220;
        *(undefined8 *)local_178 = local_228;
        *(undefined8 *)(local_178 + 2) = uStack_220;
        local_178 = local_178 + 4;
        fStack_134 = local_138;
        fStack_130 = local_138;
        fStack_12c = local_138;
        local_128 = local_138;
        fStack_114 = local_118;
        fStack_110 = local_118;
        fStack_10c = local_118;
        local_fc = local_118;
        local_98 = local_218;
        uStack_90 = uStack_210;
        local_88 = uVar1;
        uStack_80 = uVar2;
        local_68 = local_218;
        uStack_60 = uStack_210;
        local_58 = local_1e8;
        uStack_50 = uStack_1e0;
        local_38 = local_1f8;
        uStack_30 = uStack_1f0;
      }
    }
  }
  else {
    for (local_22c = 0; local_22c < local_164; local_22c = local_22c + 1) {
      ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                         (int)((ulong)in_RDI >> 0x20));
      pfVar4 = ncnn::Mat::operator_cast_to_float_(&local_280);
      ncnn::Mat::~Mat((Mat *)0x8e4915);
      local_238 = pfVar4;
      for (in_stack_fffffffffffffd7c = 0; in_stack_fffffffffffffd7c < local_168;
          in_stack_fffffffffffffd7c = in_stack_fffffffffffffd7c + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_238) {
          pfVar4 = (float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
          if (*local_238 < *pfVar4 || *local_238 == *pfVar4) {
            *local_238 = *local_238 *
                         (*local_238 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)
                         + *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
          }
        }
        else {
          *local_238 = 0.0;
        }
        local_238 = local_238 + 1;
      }
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}